

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QList<Qt::DayOfWeek> * __thiscall
QLocale::weekdays(QList<Qt::DayOfWeek> *__return_storage_ptr__,QLocale *this)

{
  uint uVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  int day;
  parameter_type t;
  parameter_type pVar4;
  parameter_type pVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (pQVar2->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (DayOfWeek *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68._16_8_ = 0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_48,pQVar3,0x1e);
    qvariant_cast<QList<Qt::DayOfWeek>>(__return_storage_ptr__,&local_48);
    ::QVariant::~QVariant(&local_48);
    ::QVariant::~QVariant((QVariant *)&local_68);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_002dde85;
    QArrayDataPointer<Qt::DayOfWeek>::~QArrayDataPointer(&__return_storage_ptr__->d);
    pQVar2 = (this->d).d.ptr;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (DayOfWeek *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar1 = *(uint *)&pQVar2->m_data->field_0x78;
  pVar5 = uVar1 >> 8 & Sunday;
  pVar4 = uVar1 >> 0xb & Sunday;
  for (t = Monday; t != 8; t = t + Monday) {
    if (((pVar5 <= pVar4) && (pVar4 < t || t < pVar5)) ||
       ((pVar4 < pVar5 && ((pVar4 < t && (t < pVar5)))))) {
      QList<Qt::DayOfWeek>::append(__return_storage_ptr__,t);
    }
  }
LAB_002dde85:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<Qt::DayOfWeek> QLocale::weekdays() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res
            = qvariant_cast<QList<Qt::DayOfWeek> >(systemLocale()->query(QSystemLocale::Weekdays));
        if (!res.isEmpty())
            return res;
    }
#endif
    QList<Qt::DayOfWeek> weekdays;
    quint16 weekendStart = d->m_data->m_weekend_start;
    quint16 weekendEnd = d->m_data->m_weekend_end;
    for (int day = Qt::Monday; day <= Qt::Sunday; day++) {
        if ((weekendEnd >= weekendStart && (day < weekendStart || day > weekendEnd)) ||
            (weekendEnd < weekendStart && (day > weekendEnd && day < weekendStart)))
                weekdays << static_cast<Qt::DayOfWeek>(day);
    }
    return weekdays;
}